

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileListOperation<duckdb::string_t,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>
               (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  data_ptr_t pdVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  FunctionData *pFVar4;
  Vector *pVVar5;
  idx_t iVar6;
  reference q_00;
  uint64_t uVar7;
  idx_t n;
  unsigned_long *q;
  _func_int **pp_Var8;
  idx_t iVar9;
  string_t sVar10;
  QuantileDirect<duckdb::string_t> local_89;
  list_entry_t *local_88;
  FunctionData *local_80;
  AggregateFinalizeData *local_78;
  pointer local_70;
  vector<duckdb::QuantileValue,_true> *local_68;
  Vector *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_88 = target;
    pFVar4 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    pVVar5 = ListVector::GetEntry(finalize_data->result);
    iVar6 = ListVector::GetListSize(finalize_data->result);
    local_68 = (vector<duckdb::QuantileValue,_true> *)(pFVar4 + 1);
    local_78 = finalize_data;
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar4[2]._vptr_FunctionData - (long)pFVar4[1]._vptr_FunctionData) /
                        0x68 + iVar6);
    local_70 = (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
               super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
               super__Vector_impl_data._M_start;
    pdVar1 = pVVar5->data;
    local_88->offset = iVar6;
    pp_Var2 = pFVar4[5]._vptr_FunctionData;
    iVar9 = 0;
    local_80 = pFVar4;
    local_60 = pVVar5;
    for (pp_Var8 = pFVar4[4]._vptr_FunctionData; pp_Var8 != pp_Var2; pp_Var8 = pp_Var8 + 1) {
      q_00 = vector<duckdb::QuantileValue,_true>::get<true>(local_68,(size_type)*pp_Var8);
      n = (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
      local_58.desc = *(bool *)&local_80[7]._vptr_FunctionData;
      local_58.FRN = Interpolator<true>::Index(q_00,n);
      local_58.CRN = local_58.FRN;
      local_58.begin = iVar9;
      local_58.end = n;
      sVar10 = Interpolator<true>::
               Operation<duckdb::string_t,duckdb::string_t,duckdb::QuantileDirect<duckdb::string_t>>
                         (&local_58,local_70,local_60,&local_89);
      p_Var3 = *pp_Var8;
      *(long *)(pdVar1 + (long)p_Var3 * 0x10 + iVar6 * 0x10) = sVar10.value._0_8_;
      *(long *)(pdVar1 + (long)p_Var3 * 0x10 + iVar6 * 0x10 + 8) = sVar10.value._8_8_;
      iVar9 = local_58.FRN;
    }
    uVar7 = ((long)local_80[2]._vptr_FunctionData - (long)local_80[1]._vptr_FunctionData) / 0x68;
    local_88->length = uVar7;
    ListVector::SetListSize(local_78->result,uVar7 + local_88->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}